

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  unique_ptr<testbench::machine,_std::default_delete<testbench::machine>_> uVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  char **ppcVar9;
  string argument;
  allocator local_71;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  sVar5 = testbench::machine::availability::count();
  if (sVar5 == 0) {
    main_cold_4();
    iVar4 = 1;
  }
  else {
    pcVar1 = *argv;
    if ((pcVar1 != (char *)0x0) && (program_name = pcVar1, argv[1] != (char *)0x0)) {
      ppcVar9 = argv + 1;
      do {
        std::__cxx11::string::string((string *)&local_50,*ppcVar9,&local_71);
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_50), iVar4 == 0))
        {
          iVar4 = 0;
LAB_00105717:
          usage_exit(iVar4);
LAB_0010571c:
          main_cold_3();
LAB_00105721:
          main_cold_2();
          goto LAB_00105726;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_50), iVar4 == 0))
        {
          pcVar1 = ppcVar9[1];
          iVar4 = 2;
          if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) goto LAB_00105717;
          piVar7 = __errno_location();
          *piVar7 = 0;
          trace_file = (FILE *)fopen(pcVar1,"w");
          if ((FILE *)trace_file != (FILE *)0x0) {
            ppcVar9 = ppcVar9 + 2;
            goto LAB_0010560e;
          }
          goto LAB_0010571c;
        }
        ppcVar9 = ppcVar9 + 1;
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar4 != 0) {
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,local_50,local_48 + (long)local_50);
          bVar3 = testbench::machine::availability::is((char *)local_70[0]);
          if (!bVar3) {
            main_cold_1();
LAB_001055a6:
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            goto LAB_0010560e;
          }
          uVar6._M_t.
          super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t.
          super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
          super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
               (__uniq_ptr_data<testbench::machine,_std::default_delete<testbench::machine>,_true,_true>
                )testbench::machine::create((char *)local_70[0]);
          if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
              machine._M_t.
              super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
              _M_t.
              super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
              .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0) {
            lVar2 = *(long *)machine._M_t.
                             super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                             .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
            machine._M_t.
            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t
            .super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
            super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                 uVar6._M_t.
                 super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                 .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
            (**(code **)(lVar2 + 0x28))();
            uVar6._M_t.
            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t
            .super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
            super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
                 machine._M_t.
                 super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                 .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
          }
          machine._M_t.
          super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t.
          super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
          super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl =
               uVar6._M_t.
               super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
               _M_t.
               super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
               .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl;
          if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
              machine._M_t.
              super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>.
              _M_t.
              super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
              .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0)
          goto LAB_001055a6;
          goto LAB_00105721;
        }
        print_stats_on_exit = true;
LAB_0010560e:
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      } while (*ppcVar9 != (char *)0x0);
    }
    if ((__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)
        machine._M_t.
        super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>._M_t.
        super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>.
        super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>)0x0) {
LAB_00105726:
      usage_exit(2);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    if (trace_file != (FILE *)0x0) {
      (**(code **)(*(long *)machine._M_t.
                            super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                            .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl + 8))()
      ;
    }
    uVar8 = (*(code *)**(undefined8 **)
                        machine._M_t.
                        super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                        .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl)
                      (machine._M_t.
                       super___uniq_ptr_impl<testbench::machine,_std::default_delete<testbench::machine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testbench::machine_*,_std::default_delete<testbench::machine>_>
                       .super__Head_base<0UL,_testbench::machine_*,_false>._M_head_impl,_stdin,
                       _stdout);
    iVar4 = 0;
    if (print_stats_on_exit == true) {
      iVar4 = 0;
      printf("\nCycles: %llu\n",uVar8);
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
    testbench::run_result result;

    if (testbench::machine::available.count() == 0) {   // forgot to link implementations?
        fputs("Fatal error no machines implemented\n", stderr);
        return 1;
    }
    process_arguments(argv);
    if (not machine) usage_exit(2);
    if (trace_file != nullptr) {
        machine->enable_trace(trace_file);
    }
    result = machine->run(stdin, stdout);
    if (print_stats_on_exit) {
        print_run_result(result);
    }
}